

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool __thiscall
icu_63::UnicodeStringAppendable::appendCodePoint(UnicodeStringAppendable *this,UChar32 c)

{
  bool bVar1;
  UBool UVar2;
  UnicodeString *this_00;
  bool local_29;
  int32_t local_1c;
  UChar local_18;
  ushort uStack_16;
  UBool isError;
  int32_t cLength;
  UChar buffer [2];
  UChar32 c_local;
  UnicodeStringAppendable *this_local;
  
  local_1c = 0;
  bVar1 = false;
  if ((uint)c < 0x10000) {
    local_1c = 1;
    local_18 = (UChar)c;
  }
  else {
    bVar1 = 0x10ffff < (uint)c;
    if (!bVar1) {
      local_18 = (short)(c >> 10) + L'ퟀ';
      uStack_16 = (UChar)c & 0x3ffU | 0xdc00;
      local_1c = 2;
    }
  }
  local_29 = false;
  if (!bVar1) {
    cLength = c;
    _buffer = this;
    this_00 = UnicodeString::doAppend(this->str,&local_18,0,local_1c);
    UVar2 = UnicodeString::isWritable(this_00);
    local_29 = UVar2 != '\0';
  }
  return local_29;
}

Assistant:

UBool
UnicodeStringAppendable::appendCodePoint(UChar32 c) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t cLength = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, cLength, U16_MAX_LENGTH, c, isError);
  return !isError && str.doAppend(buffer, 0, cLength).isWritable();
}